

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_compressionJob(void *jobDescription)

{
  rawSeqStore_t seqStore;
  rawSeqStore_t seq;
  int iVar1;
  uint uVar2;
  ZSTD_CCtx *cctx_00;
  size_t sVar3;
  BYTE *pBVar4;
  buffer_t bVar5;
  size_t local_1e0;
  size_t local_1d8;
  unsigned_long_long local_1d0;
  size_t cSize_1;
  size_t lastBlockSize;
  size_t lastBlockSize1;
  size_t cSize;
  int chunkNb;
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  BYTE *ip;
  int nbChunks;
  size_t chunkSize;
  size_t hSize;
  size_t initError_1;
  size_t forceWindowError;
  U64 pledgedSrcSize;
  size_t initError;
  void *local_f0;
  size_t local_e8;
  size_t lastCBlockSize;
  buffer_t dstBuff;
  rawSeqStore_t rawSeqStore;
  ZSTD_CCtx *cctx;
  ZSTD_CCtx_params jobParams;
  ZSTDMT_jobDescription *job;
  void *jobDescription_local;
  
  jobParams.customMem.opaque = jobDescription;
  memcpy(&cctx,(void *)((long)jobDescription + 200),0x90);
  cctx_00 = ZSTDMT_getCCtx(*(ZSTDMT_CCtxPool **)((long)jobParams.customMem.opaque + 0x68));
  ZSTDMT_getSeq((rawSeqStore_t *)&dstBuff.capacity,
                *(ZSTDMT_seqPool **)((long)jobParams.customMem.opaque + 0x78));
  lastCBlockSize = *(size_t *)((long)jobParams.customMem.opaque + 0x88);
  dstBuff.start = *(void **)((long)jobParams.customMem.opaque + 0x90);
  local_e8 = 0;
  if (cctx_00 == (ZSTD_CCtx *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
    *(undefined8 *)((long)jobParams.customMem.opaque + 8) = 0xffffffffffffffc0;
    pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
  }
  else {
    if (lastCBlockSize == 0) {
      bVar5 = ZSTDMT_getBuffer(*(ZSTDMT_bufferPool **)((long)jobParams.customMem.opaque + 0x70));
      initError = (size_t)bVar5.start;
      lastCBlockSize = initError;
      local_f0 = (void *)bVar5.capacity;
      dstBuff.start = local_f0;
      if (initError == 0) {
        pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
        *(undefined8 *)((long)jobParams.customMem.opaque + 8) = 0xffffffffffffffc0;
        pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
        goto LAB_001fb980;
      }
      *(size_t *)((long)jobParams.customMem.opaque + 0x88) = initError;
      *(void **)((long)jobParams.customMem.opaque + 0x90) = local_f0;
    }
    if ((jobParams.overlapLog == 0) || (dstBuff.capacity != 0)) {
      if (*(int *)((long)jobParams.customMem.opaque + 0xb8) != 0) {
        jobParams.cParams.strategy = 0;
      }
      jobParams.overlapLog = 0;
      if (*(long *)((long)jobParams.customMem.opaque + 0x158) == 0) {
        if (*(int *)((long)jobParams.customMem.opaque + 0xbc) == 0) {
          local_1d0 = *(unsigned_long_long *)((long)jobParams.customMem.opaque + 0xb0);
        }
        else {
          local_1d0 = *(unsigned_long_long *)((long)jobParams.customMem.opaque + 0x160);
        }
        sVar3 = ZSTD_CCtxParams_setParameter
                          ((ZSTD_CCtx_params *)&cctx,ZSTD_c_experimentalParam3,
                           (uint)((*(int *)((long)jobParams.customMem.opaque + 0xbc) != 0 ^ 0xffU) &
                                 1));
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = sVar3;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          goto LAB_001fb980;
        }
        sVar3 = ZSTD_compressBegin_advanced_internal
                          (cctx_00,*(void **)((long)jobParams.customMem.opaque + 0x98),
                           *(size_t *)((long)jobParams.customMem.opaque + 0xa0),ZSTD_dct_rawContent,
                           ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,(ZSTD_CCtx_params *)&cctx,local_1d0);
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = sVar3;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          goto LAB_001fb980;
        }
      }
      else {
        sVar3 = ZSTD_compressBegin_advanced_internal
                          (cctx_00,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,
                           *(ZSTD_CDict **)((long)jobParams.customMem.opaque + 0x158),
                           (ZSTD_CCtx_params *)&cctx,
                           *(unsigned_long_long *)((long)jobParams.customMem.opaque + 0x160));
        if (*(int *)((long)jobParams.customMem.opaque + 0xbc) == 0) {
          __assert_fail("job->firstJob",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4d07,"void ZSTDMT_compressionJob(void *)");
        }
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = sVar3;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          goto LAB_001fb980;
        }
      }
      seqStore.pos = (size_t)rawSeqStore.seq;
      seqStore.seq = (rawSeq *)dstBuff.capacity;
      seqStore.size = rawSeqStore.pos;
      seqStore.capacity = rawSeqStore.size;
      ZSTDMT_serialState_update
                (*(serialState_t **)((long)jobParams.customMem.opaque + 0x80),cctx_00,seqStore,
                 *(range_t *)((long)jobParams.customMem.opaque + 0xa8),
                 *(uint *)((long)jobParams.customMem.opaque + 0xb8));
      if (*(int *)((long)jobParams.customMem.opaque + 0xbc) == 0) {
        sVar3 = ZSTD_compressContinue
                          (cctx_00,(void *)lastCBlockSize,(size_t)dstBuff.start,
                           *(void **)((long)jobParams.customMem.opaque + 0xa8),0);
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = sVar3;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          goto LAB_001fb980;
        }
        ZSTD_invalidateRepCodes(cctx_00);
      }
      iVar1 = (int)(*(long *)((long)jobParams.customMem.opaque + 0xb0) + 0x7ffffU >> 0x13);
      ostart = *(BYTE **)((long)jobParams.customMem.opaque + 0xa8);
      oend = (BYTE *)lastCBlockSize;
      pBVar4 = (BYTE *)(lastCBlockSize + (long)dstBuff.start);
      if (0x3fffffff7ffff < *(ulong *)((long)jobParams.customMem.opaque + 0xb0)) {
        __assert_fail("job->src.size < ((size_t)INT_MAX) * chunkSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4d28,"void ZSTDMT_compressionJob(void *)");
      }
      if (*(long *)((long)jobParams.customMem.opaque + 8) != 0) {
        __assert_fail("job->cSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4d2a,"void ZSTDMT_compressionJob(void *)");
      }
      for (cSize._4_4_ = 1; cSize._4_4_ < iVar1; cSize._4_4_ = cSize._4_4_ + 1) {
        sVar3 = ZSTD_compressContinue(cctx_00,oend,(long)pBVar4 - (long)oend,ostart,0x80000);
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = sVar3;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          goto LAB_001fb980;
        }
        ostart = ostart + 0x80000;
        oend = oend + sVar3;
        if (pBVar4 <= oend) {
          __assert_fail("op < oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4d2f,"void ZSTDMT_compressionJob(void *)");
        }
        pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
        *(size_t *)((long)jobParams.customMem.opaque + 8) =
             sVar3 + *(long *)((long)jobParams.customMem.opaque + 8);
        *(long *)jobParams.customMem.opaque = (long)cSize._4_4_ << 0x13;
        pthread_cond_signal((pthread_cond_t *)((long)jobParams.customMem.opaque + 0x38));
        pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
      }
      if (0 < iVar1 || *(int *)((long)jobParams.customMem.opaque + 0xc0) != 0) {
        local_1d8 = *(ulong *)((long)jobParams.customMem.opaque + 0xb0) & 0x7ffff;
        if (local_1d8 == 0 && 0x7ffff < *(ulong *)((long)jobParams.customMem.opaque + 0xb0)) {
          local_1d8 = 0x80000;
        }
        if (*(int *)((long)jobParams.customMem.opaque + 0xc0) == 0) {
          local_1e0 = ZSTD_compressContinue(cctx_00,oend,(long)pBVar4 - (long)oend,ostart,local_1d8)
          ;
        }
        else {
          local_1e0 = ZSTD_compressEnd(cctx_00,oend,(long)pBVar4 - (long)oend,ostart,local_1d8);
        }
        uVar2 = ZSTD_isError(local_1e0);
        if (uVar2 == 0) {
          local_e8 = local_1e0;
        }
        else {
          pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
          *(size_t *)((long)jobParams.customMem.opaque + 8) = local_1e0;
          pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
        }
      }
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
      *(undefined8 *)((long)jobParams.customMem.opaque + 8) = 0xffffffffffffffc0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
    }
  }
LAB_001fb980:
  ZSTDMT_serialState_ensureFinished
            (*(serialState_t **)((long)jobParams.customMem.opaque + 0x80),
             *(uint *)((long)jobParams.customMem.opaque + 0xb8),
             *(size_t *)((long)jobParams.customMem.opaque + 8));
  seq.pos = (size_t)rawSeqStore.seq;
  seq.seq = (rawSeq *)dstBuff.capacity;
  seq.size = rawSeqStore.pos;
  seq.capacity = rawSeqStore.size;
  ZSTDMT_releaseSeq(*(ZSTDMT_seqPool **)((long)jobParams.customMem.opaque + 0x78),seq);
  ZSTDMT_releaseCCtx(*(ZSTDMT_CCtxPool **)((long)jobParams.customMem.opaque + 0x68),cctx_00);
  pthread_mutex_lock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
  uVar2 = ZSTD_isError(*(size_t *)((long)jobParams.customMem.opaque + 8));
  if ((uVar2 != 0) && (local_e8 != 0)) {
    __assert_fail("lastCBlockSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4d50,"void ZSTDMT_compressionJob(void *)");
  }
  *(size_t *)((long)jobParams.customMem.opaque + 8) =
       local_e8 + *(long *)((long)jobParams.customMem.opaque + 8);
  *(undefined8 *)jobParams.customMem.opaque =
       *(undefined8 *)((long)jobParams.customMem.opaque + 0xb0);
  pthread_cond_signal((pthread_cond_t *)((long)jobParams.customMem.opaque + 0x38));
  pthread_mutex_unlock((pthread_mutex_t *)((long)jobParams.customMem.opaque + 0x10));
  return;
}

Assistant:

static void ZSTDMT_compressionJob(void* jobDescription)
{
    ZSTDMT_jobDescription* const job = (ZSTDMT_jobDescription*)jobDescription;
    ZSTD_CCtx_params jobParams = job->params;   /* do not modify job->params ! copy it, modify the copy */
    ZSTD_CCtx* const cctx = ZSTDMT_getCCtx(job->cctxPool);
    rawSeqStore_t rawSeqStore = ZSTDMT_getSeq(job->seqPool);
    buffer_t dstBuff = job->dstBuff;
    size_t lastCBlockSize = 0;

    /* resources */
    if (cctx==NULL) JOB_ERROR(ERROR(memory_allocation));
    if (dstBuff.start == NULL) {   /* streaming job : doesn't provide a dstBuffer */
        dstBuff = ZSTDMT_getBuffer(job->bufPool);
        if (dstBuff.start==NULL) JOB_ERROR(ERROR(memory_allocation));
        job->dstBuff = dstBuff;   /* this value can be read in ZSTDMT_flush, when it copies the whole job */
    }
    if (jobParams.ldmParams.enableLdm && rawSeqStore.seq == NULL)
        JOB_ERROR(ERROR(memory_allocation));

    /* Don't compute the checksum for chunks, since we compute it externally,
     * but write it in the header.
     */
    if (job->jobID != 0) jobParams.fParams.checksumFlag = 0;
    /* Don't run LDM for the chunks, since we handle it externally */
    jobParams.ldmParams.enableLdm = 0;


    /* init */
    if (job->cdict) {
        size_t const initError = ZSTD_compressBegin_advanced_internal(cctx, NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast, job->cdict, &jobParams, job->fullFrameSize);
        assert(job->firstJob);  /* only allowed for first job */
        if (ZSTD_isError(initError)) JOB_ERROR(initError);
    } else {  /* srcStart points at reloaded section */
        U64 const pledgedSrcSize = job->firstJob ? job->fullFrameSize : job->src.size;
        {   size_t const forceWindowError = ZSTD_CCtxParams_setParameter(&jobParams, ZSTD_c_forceMaxWindow, !job->firstJob);
            if (ZSTD_isError(forceWindowError)) JOB_ERROR(forceWindowError);
        }
        {   size_t const initError = ZSTD_compressBegin_advanced_internal(cctx,
                                        job->prefix.start, job->prefix.size, ZSTD_dct_rawContent, /* load dictionary in "content-only" mode (no header analysis) */
                                        ZSTD_dtlm_fast,
                                        NULL, /*cdict*/
                                        &jobParams, pledgedSrcSize);
            if (ZSTD_isError(initError)) JOB_ERROR(initError);
    }   }

    /* Perform serial step as early as possible, but after CCtx initialization */
    ZSTDMT_serialState_update(job->serial, cctx, rawSeqStore, job->src, job->jobID);

    if (!job->firstJob) {  /* flush and overwrite frame header when it's not first job */
        size_t const hSize = ZSTD_compressContinue(cctx, dstBuff.start, dstBuff.capacity, job->src.start, 0);
        if (ZSTD_isError(hSize)) JOB_ERROR(hSize);
        DEBUGLOG(5, "ZSTDMT_compressionJob: flush and overwrite %u bytes of frame header (not first job)", (U32)hSize);
        ZSTD_invalidateRepCodes(cctx);
    }

    /* compress */
    {   size_t const chunkSize = 4*ZSTD_BLOCKSIZE_MAX;
        int const nbChunks = (int)((job->src.size + (chunkSize-1)) / chunkSize);
        const BYTE* ip = (const BYTE*) job->src.start;
        BYTE* const ostart = (BYTE*)dstBuff.start;
        BYTE* op = ostart;
        BYTE* oend = op + dstBuff.capacity;
        int chunkNb;
        if (sizeof(size_t) > sizeof(int)) assert(job->src.size < ((size_t)INT_MAX) * chunkSize);   /* check overflow */
        DEBUGLOG(5, "ZSTDMT_compressionJob: compress %u bytes in %i blocks", (U32)job->src.size, nbChunks);
        assert(job->cSize == 0);
        for (chunkNb = 1; chunkNb < nbChunks; chunkNb++) {
            size_t const cSize = ZSTD_compressContinue(cctx, op, oend-op, ip, chunkSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            ip += chunkSize;
            op += cSize; assert(op < oend);
            /* stats */
            ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
            job->cSize += cSize;
            job->consumed = chunkSize * chunkNb;
            DEBUGLOG(5, "ZSTDMT_compressionJob: compress new block : cSize==%u bytes (total: %u)",
                        (U32)cSize, (U32)job->cSize);
            ZSTD_pthread_cond_signal(&job->job_cond);   /* warns some more data is ready to be flushed */
            ZSTD_pthread_mutex_unlock(&job->job_mutex);
        }
        /* last block */
        assert(chunkSize > 0);
        assert((chunkSize & (chunkSize - 1)) == 0);  /* chunkSize must be power of 2 for mask==(chunkSize-1) to work */
        if ((nbChunks > 0) | job->lastJob /*must output a "last block" flag*/ ) {
            size_t const lastBlockSize1 = job->src.size & (chunkSize-1);
            size_t const lastBlockSize = ((lastBlockSize1==0) & (job->src.size>=chunkSize)) ? chunkSize : lastBlockSize1;
            size_t const cSize = (job->lastJob) ?
                 ZSTD_compressEnd     (cctx, op, oend-op, ip, lastBlockSize) :
                 ZSTD_compressContinue(cctx, op, oend-op, ip, lastBlockSize);
            if (ZSTD_isError(cSize)) JOB_ERROR(cSize);
            lastCBlockSize = cSize;
    }   }

_endJob:
    ZSTDMT_serialState_ensureFinished(job->serial, job->jobID, job->cSize);
    if (job->prefix.size > 0)
        DEBUGLOG(5, "Finished with prefix: %zx", (size_t)job->prefix.start);
    DEBUGLOG(5, "Finished with source: %zx", (size_t)job->src.start);
    /* release resources */
    ZSTDMT_releaseSeq(job->seqPool, rawSeqStore);
    ZSTDMT_releaseCCtx(job->cctxPool, cctx);
    /* report */
    ZSTD_PTHREAD_MUTEX_LOCK(&job->job_mutex);
    if (ZSTD_isError(job->cSize)) assert(lastCBlockSize == 0);
    job->cSize += lastCBlockSize;
    job->consumed = job->src.size;  /* when job->consumed == job->src.size , compression job is presumed completed */
    ZSTD_pthread_cond_signal(&job->job_cond);
    ZSTD_pthread_mutex_unlock(&job->job_mutex);
}